

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ShaderAllocator::~ShaderAllocator(ShaderAllocator *this)

{
  Shader *this_00;
  _Rb_tree_node_base *p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (this->m_shaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_shaders)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (Shader *)p_Var1[1]._M_parent;
    if (this_00 != (Shader *)0x0) {
      glu::Shader::~Shader(this_00);
      operator_delete(this_00,0x68);
    }
  }
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_glu::Shader_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_glu::Shader_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
  ::clear(&(this->m_shaders)._M_t);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_glu::Shader_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_glu::Shader_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
  ::~_Rb_tree(&(this->m_shaders)._M_t);
  return;
}

Assistant:

ShaderAllocator::~ShaderAllocator (void)
{
	for (std::map<glu::ShaderType, glu::Shader*>::iterator shaderIter = m_shaders.begin(); shaderIter != m_shaders.end(); shaderIter++)
		delete shaderIter->second;
	m_shaders.clear();
}